

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fRasterizationTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles2::Functional::anon_unknown_1::CullingTest::iterate(CullingTest *this)

{
  undefined8 *puVar1;
  float fVar2;
  undefined4 uVar3;
  GLenum GVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  bool bVar7;
  int iVar8;
  undefined4 extraout_var;
  char *pcVar9;
  size_t sVar10;
  pointer pVVar11;
  RenderTarget *pRVar12;
  pointer pVVar13;
  int iVar14;
  long lVar15;
  float *pfVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> drawBuffer;
  Surface resultImage;
  Random rnd;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_228;
  vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  local_208;
  CullingTest *local_1f0;
  Surface local_1e8;
  RasterizationArguments local_1d0;
  undefined1 local_1b8 [8];
  pointer pSStack_1b0;
  pointer local_1a8;
  float afStack_1a0 [2];
  float local_198 [2];
  float afStack_190 [2];
  float local_188 [12];
  bool local_158;
  bool local_157;
  bool local_156;
  ios_base local_140 [272];
  
  iVar8 = (this->super_BaseRenderingCase).m_renderSize;
  tcu::Surface::Surface(&local_1e8,iVar8,iVar8);
  local_228.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_228.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_228.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_208.
  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_208.
  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.
  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  deRandom_init((deRandom *)local_1b8,0x849ea);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize(&local_228,6);
  if (0 < (int)((ulong)((long)local_228.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_228.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4)) {
    lVar18 = 0;
    lVar17 = 0;
    do {
      fVar20 = deRandom_getFloat((deRandom *)local_1b8);
      *(float *)((long)(local_228.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar18) =
           fVar20 * 1.8 + -0.9;
      fVar20 = deRandom_getFloat((deRandom *)local_1b8);
      *(float *)((long)(local_228.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar18 + 4) =
           fVar20 * 1.8 + -0.9;
      *(undefined8 *)
       ((long)(local_228.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start)->m_data + lVar18 + 8) = 0x3f80000000000000;
      lVar17 = lVar17 + 1;
      lVar18 = lVar18 + 0x10;
    } while (lVar17 < (int)((ulong)((long)local_228.
                                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_228.
                                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 4));
  }
  if (this->m_cullMode != 0x408) {
    bVar7 = (this->m_cullMode == 0x404) != (this->m_faceOrder == 0x901);
    GVar4 = this->m_primitive;
    if (GVar4 == 4) {
      if (0 < (int)((ulong)((long)local_228.
                                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_228.
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4) + -2) {
        iVar8 = 0;
        pVVar11 = local_228.
                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pVVar13 = local_228.
                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        do {
          iVar14 = iVar8 + 2;
          auVar26._4_4_ = pVVar11[iVar8].m_data[0];
          auVar26._0_4_ = pVVar11[(long)iVar8 + 1].m_data[0];
          auVar26._8_8_ = 0;
          auVar22._4_4_ = pVVar11[iVar8].m_data[3];
          auVar22._0_4_ = pVVar11[(long)iVar8 + 1].m_data[3];
          auVar22._8_8_ = 0;
          auVar22 = divps(auVar26,auVar22);
          auVar30._4_4_ = pVVar11[iVar8].m_data[1];
          auVar30._0_4_ = pVVar11[iVar14].m_data[1];
          auVar30._8_8_ = 0;
          auVar28._4_4_ = pVVar11[iVar8].m_data[3];
          auVar28._0_4_ = pVVar11[iVar14].m_data[3];
          auVar28._8_8_ = 0;
          auVar28 = divps(auVar30,auVar28);
          if (bVar7 != (auVar28._0_4_ - auVar28._4_4_) * (auVar22._0_4_ - auVar22._4_4_) -
                       (pVVar11[(long)iVar8 + 1].m_data[1] / pVVar11[(long)iVar8 + 1].m_data[3] -
                       auVar28._4_4_) *
                       (pVVar11[iVar14].m_data[0] / pVVar11[iVar14].m_data[3] - auVar22._4_4_) < 0.0
             ) {
            local_188[8] = 0.0;
            local_188[9] = 0.0;
            local_188[10] = 0.0;
            local_188[0xb] = 0.0;
            local_188[4] = 0.0;
            local_188[5] = 0.0;
            local_188[6] = 0.0;
            local_188[7] = 0.0;
            local_188[0] = 0.0;
            local_188[1] = 0.0;
            local_188[2] = 0.0;
            local_188[3] = 0.0;
            local_1b8 = *(undefined1 (*) [8])pVVar11[iVar8].m_data;
            pSStack_1b0 = *(pointer *)(pVVar11[iVar8].m_data + 2);
            local_158 = false;
            local_1a8 = *(pointer *)pVVar11[(long)iVar8 + 1].m_data;
            afStack_1a0 = *(float (*) [2])(pVVar11[(long)iVar8 + 1].m_data + 2);
            local_157 = false;
            local_198 = *(float (*) [2])pVVar11[iVar14].m_data;
            afStack_190 = *(float (*) [2])(pVVar11[iVar14].m_data + 2);
            local_156 = false;
            std::
            vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
            ::push_back(&local_208,(value_type *)local_1b8);
            pVVar11 = local_228.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pVVar13 = local_228.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          }
          iVar8 = iVar8 + 3;
        } while (iVar8 < (int)((ulong)((long)pVVar13 - (long)pVVar11) >> 4) + -2);
      }
    }
    else if (GVar4 == 5) {
      if (0 < (int)((ulong)((long)local_228.
                                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_228.
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4) + -2) {
        lVar18 = 0x200000000;
        lVar19 = 0;
        lVar17 = 0;
        pVVar11 = local_228.
                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pVVar13 = local_228.
                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        local_1f0 = this;
        do {
          lVar15 = lVar18 >> 0x1c;
          fVar20 = *(float *)((long)pVVar11[1].m_data + lVar19 + 0xc);
          uVar3 = *(undefined4 *)((long)pVVar11->m_data + lVar19 + 0xc);
          auVar25._4_4_ = *(undefined4 *)((long)pVVar11->m_data + lVar19);
          auVar25._0_4_ = *(undefined4 *)((long)pVVar11[1].m_data + lVar19);
          auVar25._8_8_ = 0;
          auVar6._4_4_ = uVar3;
          auVar6._0_4_ = fVar20;
          auVar6._8_8_ = 0;
          auVar22 = divps(auVar25,auVar6);
          fVar2 = *(float *)((long)pVVar11->m_data + lVar15 + 0xc);
          auVar29._4_4_ = *(undefined4 *)((long)pVVar11->m_data + lVar19 + 4);
          auVar29._0_4_ = *(undefined4 *)((long)pVVar11->m_data + lVar15 + 4);
          auVar29._8_8_ = 0;
          auVar23._4_4_ = uVar3;
          auVar23._0_4_ = fVar2;
          auVar23._8_8_ = 0;
          auVar28 = divps(auVar29,auVar23);
          if (((uint)lVar17 & 1 ^ (uint)bVar7) !=
              (uint)((auVar28._0_4_ - auVar28._4_4_) * (auVar22._0_4_ - auVar22._4_4_) -
                     (*(float *)((long)pVVar11[1].m_data + lVar19 + 4) / fVar20 - auVar28._4_4_) *
                     (*(float *)((long)pVVar11->m_data + lVar15) / fVar2 - auVar22._4_4_) < 0.0)) {
            puVar1 = (undefined8 *)((long)pVVar11->m_data + lVar19);
            pfVar16 = (float *)((long)pVVar11->m_data + lVar15);
            local_188[8] = 0.0;
            local_188[9] = 0.0;
            local_188[10] = 0.0;
            local_188[0xb] = 0.0;
            local_188[4] = 0.0;
            local_188[5] = 0.0;
            local_188[6] = 0.0;
            local_188[7] = 0.0;
            local_188[0] = 0.0;
            local_188[1] = 0.0;
            local_188[2] = 0.0;
            local_188[3] = 0.0;
            local_1b8 = (undefined1  [8])*puVar1;
            pSStack_1b0 = (pointer)puVar1[1];
            local_158 = false;
            local_1a8 = *(pointer *)((long)pVVar11[1].m_data + lVar19);
            afStack_1a0 = *(float (*) [2])((long)pVVar11[1].m_data + lVar19 + 8);
            local_157 = false;
            local_198 = *(float (*) [2])pfVar16;
            afStack_190 = *(float (*) [2])(pfVar16 + 2);
            local_156 = false;
            std::
            vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
            ::push_back(&local_208,(value_type *)local_1b8);
            pVVar11 = local_228.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pVVar13 = local_228.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            this = local_1f0;
          }
          lVar17 = lVar17 + 1;
          lVar18 = lVar18 + 0x100000000;
          lVar19 = lVar19 + 0x10;
        } while (lVar17 < ((long)pVVar13 - (long)pVVar11) * 0x10000000 + -0x200000000 >> 0x20);
      }
    }
    else if ((GVar4 == 6) &&
            (1 < (int)((ulong)((long)local_228.
                                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_228.
                                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 4) + -1)) {
      lVar17 = 1;
      lVar18 = 0x10;
      pVVar11 = local_228.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pVVar13 = local_228.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      do {
        fVar20 = *(float *)((long)pVVar11->m_data + lVar18 + 0xc);
        auVar21._4_4_ = pVVar11->m_data[0];
        auVar21._0_4_ = *(undefined4 *)((long)pVVar11->m_data + lVar18);
        auVar21._8_8_ = 0;
        auVar5._4_4_ = pVVar11->m_data[3];
        auVar5._0_4_ = fVar20;
        auVar5._8_8_ = 0;
        auVar22 = divps(auVar21,auVar5);
        fVar2 = *(float *)((long)pVVar11[1].m_data + lVar18 + 0xc);
        auVar27._4_4_ = pVVar11->m_data[1];
        auVar27._0_4_ = *(undefined4 *)((long)pVVar11[1].m_data + lVar18 + 4);
        auVar27._8_8_ = 0;
        auVar24._4_4_ = pVVar11->m_data[3];
        auVar24._0_4_ = fVar2;
        auVar24._8_8_ = 0;
        auVar28 = divps(auVar27,auVar24);
        if (bVar7 != (auVar28._0_4_ - auVar28._4_4_) * (auVar22._0_4_ - auVar22._4_4_) -
                     (*(float *)((long)pVVar11->m_data + lVar18 + 4) / fVar20 - auVar28._4_4_) *
                     (*(float *)((long)pVVar11[1].m_data + lVar18) / fVar2 - auVar22._4_4_) < 0.0) {
          pfVar16 = (float *)((long)pVVar11->m_data + lVar18);
          local_188[8] = 0.0;
          local_188[9] = 0.0;
          local_188[10] = 0.0;
          local_188[0xb] = 0.0;
          local_188[4] = 0.0;
          local_188[5] = 0.0;
          local_188[6] = 0.0;
          local_188[7] = 0.0;
          local_188[0] = 0.0;
          local_188[1] = 0.0;
          local_188[2] = 0.0;
          local_188[3] = 0.0;
          local_1b8 = *(undefined1 (*) [8])pVVar11->m_data;
          pSStack_1b0 = *(pointer *)(pVVar11->m_data + 2);
          local_158 = false;
          local_1a8 = *(pointer *)pfVar16;
          afStack_1a0 = *(float (*) [2])(pfVar16 + 2);
          local_157 = false;
          local_198 = *(float (*) [2])((long)pVVar11[1].m_data + lVar18);
          afStack_190 = *(float (*) [2])((long)pVVar11[1].m_data + lVar18 + 8);
          local_156 = false;
          std::
          vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
          ::push_back(&local_208,(value_type *)local_1b8);
          pVVar11 = local_228.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pVVar13 = local_228.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        }
        lVar17 = lVar17 + 1;
        lVar18 = lVar18 + 0x10;
      } while (lVar17 < ((long)pVVar13 - (long)pVVar11) * 0x10000000 + -0x100000000 >> 0x20);
    }
  }
  iVar8 = (*((this->super_BaseRenderingCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar17 = CONCAT44(extraout_var,iVar8);
  (**(code **)(lVar17 + 0x5e0))(0xb44);
  (**(code **)(lVar17 + 0x418))(this->m_cullMode);
  (**(code **)(lVar17 + 0x6c0))(this->m_faceOrder);
  local_1b8 = (undefined1  [8])
              ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
              m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pSStack_1b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&pSStack_1b0,"Setting front face to ",0x16);
  pcVar9 = glu::getWindingName(this->m_faceOrder);
  iVar8 = (int)(ostringstream *)&pSStack_1b0;
  if (pcVar9 == (char *)0x0) {
    std::ios::clear(iVar8 + (int)*(undefined8 *)(pSStack_1b0[-1].colors[1].m_data + 3));
  }
  else {
    sVar10 = strlen(pcVar9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pSStack_1b0,pcVar9,sVar10);
  }
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pSStack_1b0);
  std::ios_base::~ios_base(local_140);
  local_1b8 = (undefined1  [8])
              ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
              m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pSStack_1b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&pSStack_1b0,"Setting cull face to ",0x15);
  pcVar9 = glu::getFaceName(this->m_cullMode);
  if (pcVar9 == (char *)0x0) {
    std::ios::clear(iVar8 + (int)*(undefined8 *)(pSStack_1b0[-1].colors[1].m_data + 3));
  }
  else {
    sVar10 = strlen(pcVar9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pSStack_1b0,pcVar9,sVar10);
  }
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pSStack_1b0);
  std::ios_base::~ios_base(local_140);
  local_1b8 = (undefined1  [8])
              ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
              m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pSStack_1b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&pSStack_1b0,"Drawing test pattern (",0x16);
  pcVar9 = glu::getPrimitiveTypeName(this->m_primitive);
  if (pcVar9 == (char *)0x0) {
    std::ios::clear(iVar8 + (int)*(undefined8 *)(pSStack_1b0[-1].colors[1].m_data + 3));
  }
  else {
    sVar10 = strlen(pcVar9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pSStack_1b0,pcVar9,sVar10);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pSStack_1b0,")",1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pSStack_1b0);
  std::ios_base::~ios_base(local_140);
  BaseRenderingCase::drawPrimitives
            (&this->super_BaseRenderingCase,&local_1e8,&local_228,this->m_primitive);
  local_1b8 = (undefined1  [8])0x0;
  pSStack_1b0 = (pointer)0x0;
  local_1a8 = (pointer)0x0;
  local_1d0.numSamples = (this->super_BaseRenderingCase).m_numSamples;
  local_1d0.subpixelBits = (this->super_BaseRenderingCase).m_subpixelBits;
  pRVar12 = Context::getRenderTarget((this->super_BaseRenderingCase).super_TestCase.m_context);
  local_1d0.redBits = (pRVar12->m_pixelFormat).redBits;
  pRVar12 = Context::getRenderTarget((this->super_BaseRenderingCase).super_TestCase.m_context);
  local_1d0.greenBits = (pRVar12->m_pixelFormat).greenBits;
  pRVar12 = Context::getRenderTarget((this->super_BaseRenderingCase).super_TestCase.m_context);
  local_1d0.blueBits = (pRVar12->m_pixelFormat).blueBits;
  local_1b8 = (undefined1  [8])
              local_208.
              super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
              ._M_impl.super__Vector_impl_data._M_start;
  pSStack_1b0 = local_208.
                super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  local_1a8 = local_208.
              super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_208.
  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.
  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_208.
  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar7 = tcu::verifyTriangleGroupRasterization
                    (&local_1e8,(TriangleSceneSpec *)local_1b8,&local_1d0,
                     ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
                     m_testCtx)->m_log,VERIFICATIONMODE_WEAK);
  pcVar9 = "Incorrect rendering";
  if (bVar7) {
    pcVar9 = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             (uint)!bVar7,pcVar9);
  if (local_1b8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_1b8,(long)local_1a8 - (long)local_1b8);
  }
  if (local_208.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_208.
                    super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_208.
                          super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_208.
                          super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_228.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_228.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_228.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_228.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  tcu::Surface::~Surface(&local_1e8);
  return STOP;
}

Assistant:

CullingTest::IterateResult CullingTest::iterate (void)
{
	tcu::Surface									resultImage(m_renderSize, m_renderSize);
	std::vector<tcu::Vec4>							drawBuffer;
	std::vector<TriangleSceneSpec::SceneTriangle>	triangles;

	// generate scene
	generateVertices(drawBuffer);
	extractTriangles(triangles, drawBuffer);

	// draw image
	{
		const glw::Functions& gl = m_context.getRenderContext().getFunctions();

		gl.enable(GL_CULL_FACE);
		gl.cullFace(m_cullMode);
		gl.frontFace(m_faceOrder);

		m_testCtx.getLog() << tcu::TestLog::Message << "Setting front face to " << glu::getWindingName(m_faceOrder) << tcu::TestLog::EndMessage;
		m_testCtx.getLog() << tcu::TestLog::Message << "Setting cull face to " << glu::getFaceName(m_cullMode) << tcu::TestLog::EndMessage;
		m_testCtx.getLog() << tcu::TestLog::Message << "Drawing test pattern (" << glu::getPrimitiveTypeName(m_primitive) << ")" << tcu::TestLog::EndMessage;

		drawPrimitives(resultImage, drawBuffer, m_primitive);
	}

	// compare
	{
		RasterizationArguments	args;
		TriangleSceneSpec		scene;

		args.numSamples		= m_numSamples;
		args.subpixelBits	= m_subpixelBits;
		args.redBits		= m_context.getRenderTarget().getPixelFormat().redBits;
		args.greenBits		= m_context.getRenderTarget().getPixelFormat().greenBits;
		args.blueBits		= m_context.getRenderTarget().getPixelFormat().blueBits;

		scene.triangles.swap(triangles);

		if (verifyTriangleGroupRasterization(resultImage, scene, args, m_testCtx.getLog(), tcu::VERIFICATIONMODE_WEAK))
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Incorrect rendering");
	}

	return STOP;
}